

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O1

void testExactL2<makeTests(TasGrid::TypeAcceleration,int)::__16>(TasmanianSparseGrid *grid)

{
  double dVar1;
  pointer pdVar2;
  TasmanianSparseGrid *grid_00;
  pointer pdVar3;
  char cVar4;
  TypeOneDRule TVar5;
  long lVar6;
  ostream *poVar7;
  runtime_error *this;
  long lVar8;
  BaseCanonicalGrid *pBVar9;
  BaseCanonicalGrid *pBVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> x;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  data;
  vector<double,_std::allocator<double>_> y;
  TasmanianSparseGrid ref_grid;
  allocator_type local_15a;
  allocator_type local_159;
  vector<double,_std::allocator<double>_> local_158;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  TasmanianSparseGrid *local_108;
  long local_100;
  vector<double,_std::allocator<double>_> local_f8;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  TasmanianSparseGrid local_b0;
  
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbfe0000000000000;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbfe0000000000000;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xbfe0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_138;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b0,__l,&local_15a);
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fe6666666666666;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe6666666666666;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe6666666666666;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_158,__l_00,&local_159);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_b0);
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.acceleration._M_t.
      super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
      .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
       )0x0) {
    operator_delete((void *)local_b0.acceleration._M_t.
                            super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                            .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>.
                            _M_head_impl,
                    (long)local_b0.domain_transform_a.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start -
                    (long)local_b0.acceleration._M_t.
                          super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                          .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl
                   );
  }
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&local_b0,grid);
  pBVar10 = (grid->base)._M_t.
            super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar10 == (BaseCanonicalGrid *)0x0) {
    lVar14 = 0;
  }
  else {
    lVar14 = (long)*(int *)(pBVar10 + 0x10);
  }
  uVar12 = 0;
  if (pBVar10 == (BaseCanonicalGrid *)0x0) {
    lVar15 = 0;
  }
  else {
    lVar15 = (long)*(int *)(pBVar10 + 0x14);
    pBVar9 = pBVar10 + 0x20;
    if (*(long *)(pBVar10 + 0x28) == *(long *)(pBVar10 + 0x30)) {
      pBVar9 = pBVar10 + 0x48;
    }
    uVar12 = *(uint *)pBVar9;
  }
  TasGrid::TasmanianSparseGrid::getPoints(&local_158,grid);
  pBVar10 = (grid->base)._M_t.
            super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar10 == (BaseCanonicalGrid *)0x0) {
    lVar6 = 0;
    lVar11 = 0;
  }
  else {
    lVar6 = (long)*(int *)(pBVar10 + 0x14);
    pBVar9 = pBVar10 + 0x20;
    if (*(long *)(pBVar10 + 0x28) == *(long *)(pBVar10 + 0x30)) {
      pBVar9 = pBVar10 + 0x48;
    }
    lVar11 = (long)*(int *)pBVar9;
  }
  local_108 = grid;
  std::vector<double,_std::allocator<double>_>::vector(&local_f8,lVar11 * lVar6,&local_15a);
  if (0 < (int)uVar12) {
    uVar13 = (ulong)uVar12;
    local_100 = lVar15 << 3;
    lVar6 = 0x10;
    lVar15 = 0x10;
    do {
      pdVar3 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = *(double *)
               ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6 + -8) + -0.3;
      dVar1 = exp((*(double *)
                    ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar6) + 0.4) *
                  -(*(double *)
                     ((long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6 + -0x10) + -0.1) * dVar1 *
                  dVar1);
      *(double *)((long)pdVar3 + lVar15 + -0x10) = dVar1;
      dVar1 = exp((*(double *)((long)pdVar2 + lVar6) + 0.3) *
                  (*(double *)((long)pdVar2 + lVar6 + -8) + -0.2) *
                  -(*(double *)((long)pdVar2 + lVar6 + -0x10) + -0.1));
      lVar11 = local_100;
      *(double *)((long)pdVar3 + lVar15 + -8) = dVar1;
      dVar1 = exp((*(double *)((long)pdVar2 + lVar6) + -0.1) *
                  (*(double *)((long)pdVar2 + lVar6 + -8) + 0.1) *
                  -(*(double *)((long)pdVar2 + lVar6 + -0x10) + 0.3));
      *(double *)((long)pdVar3 + lVar15) = dVar1;
      lVar15 = lVar15 + lVar11;
      lVar6 = lVar6 + lVar14 * 8;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_double_*,_double_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:184:20)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_double_*,_double_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:184:20)>
             ::_M_manager;
  TasGrid::loadNeededPoints<true,false>
            ((function<void_(const_double_*,_double_*,_unsigned_long)> *)&local_d8,&local_b0,1);
  grid_00 = local_108;
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  TVar5 = TasGrid::TasmanianSparseGrid::getRule();
  cVar4 = TasGrid::OneDimensionalMeta::isNonNested(TVar5);
  if (cVar4 == '\0') {
    uVar16 = 0;
    uVar17 = 0;
  }
  else {
    uVar16 = 0xd2f1a9fc;
    uVar17 = 0x3f50624d;
  }
  TasGrid::loadUnstructuredDataL2(&local_138,&local_120,(double)CONCAT44(uVar17,uVar16),grid_00);
  TVar5 = TasGrid::TasmanianSparseGrid::getRule();
  cVar4 = TasGrid::OneDimensionalMeta::isNonNested(TVar5);
  if (cVar4 == '\0') {
    if (local_b0.base._M_t.
        super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
        ._M_t.
        super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
        .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
         )0x0) {
      lVar14 = 0;
      lVar15 = 0;
    }
    else {
      lVar14 = (long)*(int *)((long)local_b0.base._M_t.
                                    super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                                    .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>.
                                    _M_head_impl + 0x14);
      pBVar10 = (BaseCanonicalGrid *)
                ((long)local_b0.base._M_t.
                       super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                       .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                0x20);
      if (*(long *)((long)local_b0.base._M_t.
                          super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                   0x28) ==
          *(long *)((long)local_b0.base._M_t.
                          super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                          .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                   0x30)) {
        pBVar10 = (BaseCanonicalGrid *)
                  ((long)local_b0.base._M_t.
                         super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                         .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl +
                  0x48);
      }
      lVar15 = (long)*(int *)pBVar10;
    }
    lVar6 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
    lVar11 = TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
    if (lVar15 * lVar14 != 0) {
      dVar1 = 0.0;
      lVar8 = 0;
      do {
        dVar18 = ABS(*(double *)(lVar6 + lVar8 * 8) - *(double *)(lVar11 + lVar8 * 8));
        if (dVar1 <= dVar18) {
          dVar1 = dVar18;
        }
        lVar8 = lVar8 + 1;
      } while (lVar15 * lVar14 - lVar8 != 0);
      if (1e-12 < dVar1) goto LAB_0010c3db;
    }
  }
  TVar5 = TasGrid::TasmanianSparseGrid::getRule();
  cVar4 = TasGrid::OneDimensionalMeta::isNonNested(TVar5);
  if ((cVar4 == '\0') || (dVar1 = evalDifference(&local_138,&local_b0,grid_00), dVar1 <= 0.01)) {
    if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&local_b0);
    return;
  }
LAB_0010c3db:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Failed exact unstructured construction\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Observed coefficients error: ",0x1d);
  dVar1 = coefficientDifference(&local_b0,grid_00);
  poVar7 = std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Observed evaluate error: ",0x19);
  dVar1 = evalDifference(&local_138,&local_b0,grid_00);
  poVar7 = std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  TasGrid::TasmanianSparseGrid::printStats((ostream *)grid_00);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"test failed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void testExactL2(TasmanianSparseGrid &&grid, CallableModel model){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});
    auto ref_grid = grid;

    auto data = generateExactData(grid, model);

    loadNeededPoints(model, ref_grid, 1);
    if (OneDimensionalMeta::isNonNested(grid.getRule()))
        loadUnstructuredDataL2(data.first, data.second, 1.E-3, grid);
    else
        loadUnstructuredDataL2(data.first, data.second, 0.0, grid);

    if ((not OneDimensionalMeta::isNonNested(grid.getRule()) and coefficientDifference(ref_grid, grid) > Maths::num_tol)
        or (OneDimensionalMeta::isNonNested(grid.getRule()) and evalDifference(data.first, ref_grid, grid) > 1.E-2))
    {
        cout << "Failed exact unstructured construction\n";
        cout << "Observed coefficients error: " << coefficientDifference(ref_grid, grid) << "\n";
        cout << "Observed evaluate error: " << evalDifference(data.first, ref_grid, grid) << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}